

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void __thiscall
mserialize::detail::visit_enum<binlog::ToStringVisitor,binlog::Range>
          (detail *this,string_view tag,ToStringVisitor *visitor,Range *istream)

{
  detail tag_00;
  Enum e;
  char *pcVar1;
  size_type sVar2;
  ulong uVar3;
  runtime_error *this_00;
  long lVar4;
  size_t sVar5;
  string_view sVar6;
  string_view sVar7;
  string_view local_e8;
  char *local_d8;
  ToStringVisitor *local_d0;
  IntegerToHex hex;
  char *local_98;
  size_t sStack_90;
  undefined7 uStack_87;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = (ToStringVisitor *)tag._len;
  uVar3 = (ulong)(tag._ptr != (char *)0x0);
  local_e8._ptr = (char *)(this + uVar3);
  lVar4 = (long)tag._ptr - uVar3;
  local_e8._len = 0;
  if (lVar4 != 0) {
    local_e8._len = lVar4 - 1U;
  }
  if (lVar4 != 0 && lVar4 - 1U != 0) {
    tag_00 = (detail)*local_e8._ptr;
    hex._p = hex._buffer + 0x13;
    visit_arithmetic<mserialize::detail::IntegerToHex,binlog::Range>
              ((char)tag_00,&hex,(Range *)visitor);
    uVar3 = 2;
    if (local_e8._len < 2) {
      uVar3 = local_e8._len;
    }
    local_e8._ptr = local_e8._ptr + uVar3;
    local_e8._len = local_e8._len - uVar3;
    sVar6 = remove_prefix_before(&local_e8,'\'');
    pcVar1 = hex._p;
    local_d8 = sVar6._ptr;
    hex._p[-1] = '\'';
    sVar7._ptr = pcVar1 + -1;
    hex._buffer[0x13] = '`';
    sVar5 = (long)&hex + (0x14 - (long)sVar7._ptr);
    sVar7._len = sVar5;
    sVar2 = string_view::find(&local_e8,sVar7,0);
    if (sVar2 == 0xffffffffffffffff) {
      sVar7 = (string_view)ZEXT816(0);
    }
    else {
      uVar3 = (sVar2 + sVar5) - 1;
      if (local_e8._len < uVar3) {
        uVar3 = local_e8._len;
      }
      local_e8._ptr = local_e8._ptr + uVar3;
      local_e8._len = local_e8._len - uVar3;
      sVar7 = tag_pop_label(&local_e8);
    }
    local_98 = sVar7._ptr;
    sStack_90 = sVar7._len;
    e._33_7_ = uStack_87;
    e.tag = (char)tag_00;
    e.name._len = sVar6._len;
    e.name._ptr = local_d8;
    e.enumerator._ptr = local_98;
    e.enumerator._len = sStack_90;
    e.value._ptr = hex._p;
    e.value._len = (long)(hex._buffer + 0x13) - (long)hex._p;
    binlog::ToStringVisitor::visit(local_d0,e);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  string_view::to_string_abi_cxx11_(&local_70,&local_e8);
  std::operator+(&local_50,"Invalid enum tag: \'",&local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hex,&local_50
                 ,"\'");
  std::runtime_error::runtime_error(this_00,(string *)&hex);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit_enum(string_view tag, Visitor& visitor, InputStream& istream)
{
  tag.remove_prefix(1); // drop slash
  tag.remove_suffix(1); // drop backslash

  if (tag.empty()) { throw std::runtime_error("Invalid enum tag: '" + tag.to_string() + "'"); }

  // convert the discriminator to hex
  const char underlying_type_tag = tag[0];
  IntegerToHex hex;
  visit_arithmetic(underlying_type_tag, hex, istream);

  tag.remove_prefix(2); // drop underlying_type_tag and `
  const string_view name = remove_prefix_before(tag, '\'');

  string_view enumerator;

  const string_view dvalue = hex.delimited_value('\'', '`');
  const std::size_t value_pos = tag.find(dvalue);

  if (value_pos != string_view::npos)
  {
    tag.remove_prefix(value_pos + dvalue.size() - 1);
    enumerator = tag_pop_label(tag);
  }

  visitor.visit(mserialize::Visitor::Enum{name, enumerator, underlying_type_tag, hex.value()});
}